

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void LemonAtExit(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (0 < made_files_count) {
    lVar3 = 0;
    iVar1 = made_files_count;
    iVar2 = successful_exit;
    do {
      if (iVar2 == 0) {
        remove(made_files[lVar3]);
        iVar1 = made_files_count;
        iVar2 = successful_exit;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  free(made_files);
  made_files_count = 0;
  made_files = (char **)0x0;
  return;
}

Assistant:

static void LemonAtExit(void)
{
    /* if we failed, delete (most) files we made, to unconfuse build tools. */
    int i;
    for (i = 0; i < made_files_count; i++) {
        if (!successful_exit) {
            remove(made_files[i]);
        }
    }
    free(made_files);
    made_files_count = 0;
    made_files = NULL;
}